

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPasvDataTransfer.cpp
# Opt level: O0

int __thiscall CPasvDataTransfer::GetIpAndPort(CPasvDataTransfer *this,string *ip)

{
  long lVar1;
  uint16_t uVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  size_t sVar7;
  allocator local_79;
  string local_78 [32];
  char local_58 [8];
  char addressBuffer [16];
  void *tmpAddrPtr;
  ifaddrs *ifAddrStruct;
  undefined1 local_28 [4];
  socklen_t len;
  sockaddr_in sin;
  string *ip_local;
  CPasvDataTransfer *this_local;
  
  ifAddrStruct._4_4_ = 0x10;
  sin.sin_zero = (uchar  [8])ip;
  iVar3 = getsockname(this->m_Sock,(sockaddr *)local_28,(socklen_t *)((long)&ifAddrStruct + 4));
  if (iVar3 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Get sockname error: ");
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  tmpAddrPtr = (void *)0x0;
  getifaddrs(&tmpAddrPtr);
  for (; tmpAddrPtr != (void *)0x0; tmpAddrPtr = *tmpAddrPtr) {
    if (**(short **)((long)tmpAddrPtr + 0x18) == 2) {
      lVar1 = *(long *)((long)tmpAddrPtr + 0x18);
      bzero(local_58,0x10);
      inet_ntop(2,(void *)(lVar1 + 4),local_58,0x10);
      iVar3 = strcmp(local_58,"127.0.0.1");
      if ((iVar3 != 0) && (sVar7 = strlen(local_58), 1 < sVar7)) break;
    }
  }
  sVar7 = strlen(local_58);
  if (sVar7 < 2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Get local ip error,now exit.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,local_58,&local_79);
  std::__cxx11::string::operator=((string *)sin.sin_zero,local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  uVar2 = ntohs(local_28._2_2_);
  return (int)uVar2;
}

Assistant:

int CPasvDataTransfer::GetIpAndPort(string &ip) {
    struct sockaddr_in sin;
    socklen_t  len = sizeof(sin);
    if(getsockname(m_Sock,(struct sockaddr*)&sin,&len) != 0){
        cout << "Get sockname error: " << strerror(errno) << endl;
        exit(-1);
    }
    struct ifaddrs *ifAddrStruct = NULL;
    void *tmpAddrPtr = NULL;

    getifaddrs(&ifAddrStruct);
    char addressBuffer[INET_ADDRSTRLEN];
    while(ifAddrStruct != NULL){
        if(ifAddrStruct->ifa_addr->sa_family == AF_INET){
            tmpAddrPtr = &((struct sockaddr_in *)ifAddrStruct->ifa_addr)->sin_addr;
            bzero(addressBuffer,INET_ADDRSTRLEN);
            inet_ntop(AF_INET,tmpAddrPtr,addressBuffer,INET_ADDRSTRLEN);
            if(strcmp(addressBuffer,"127.0.0.1") != 0 && strlen(addressBuffer) > 1)
                break;
        }
        ifAddrStruct = ifAddrStruct->ifa_next;
    }

    if(strlen(addressBuffer) > 1)
        ip = string(addressBuffer);
    else{
        cout << "Get local ip error,now exit." << endl;
        exit(-1);
    }
    return ntohs(sin.sin_port);
}